

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test9::iterate(GPUShaderFP64Test9 *this)

{
  _variable_type _Var1;
  bool bVar2;
  long lVar3;
  NotSupportedError *this_00;
  char *description;
  _operation_type operation_type;
  _operation_type _Var4;
  allocator<char> local_69;
  long local_68;
  _test_case test_case;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (bVar2) {
    initTest(this);
    lVar3 = 0;
    while (lVar3 != 0xd) {
      _Var1 = (&DAT_0168e070)[lVar3];
      local_68 = lVar3;
      for (_Var4 = OPERATION_TYPE_ADDITION; _Var4 != OPERATION_TYPE_COUNT;
          _Var4 = _Var4 + OPERATION_TYPE_DIVISION) {
        test_case.vs_body._M_string_length = 0;
        test_case.vs_body.field_2._M_local_buf[0] = '\0';
        test_case.operation_type = _Var4;
        test_case.result_variable_type = _Var1;
        test_case.vs_body._M_dataplus._M_p = (pointer)&test_case.vs_body.field_2;
        test_case.variable_type = _Var1;
        initTestIteration(this,&test_case);
        bVar2 = executeTestIteration(this,&test_case);
        this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
        std::__cxx11::string::~string((string *)&test_case.vs_body);
      }
      lVar3 = local_68 + 1;
    }
    bVar2 = this->m_has_test_passed == false;
    if (bVar2) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar2,
               description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_case,"GL_ARB_gpu_shader_fp64 is not supported.",&local_69);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&test_case);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test9::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize all ES objects required to run all the checks */
	initTest();

	/* Iterate through all variable types we want to test */
	const Utils::_variable_type variable_types[] = { Utils::VARIABLE_TYPE_DMAT2,   Utils::VARIABLE_TYPE_DMAT2X3,
													 Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3,
													 Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
													 Utils::VARIABLE_TYPE_DMAT4,   Utils::VARIABLE_TYPE_DMAT4X2,
													 Utils::VARIABLE_TYPE_DMAT4X3, Utils::VARIABLE_TYPE_DOUBLE,
													 Utils::VARIABLE_TYPE_DVEC2,   Utils::VARIABLE_TYPE_DVEC3,
													 Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_variable_types = sizeof(variable_types) / sizeof(variable_types[0]);

	for (unsigned int n_variable_type = 0; n_variable_type < n_variable_types; ++n_variable_type)
	{
		/* Iterate through all operation types we want to check */
		for (unsigned int n_operation_type = 0; n_operation_type < OPERATION_TYPE_COUNT; ++n_operation_type)
		{
			_operation_type				 operation_type = (_operation_type)n_operation_type;
			const Utils::_variable_type& variable_type  = variable_types[n_variable_type];

			/* Construct test case descriptor */
			_test_case test_case;

			test_case.operation_type	   = operation_type;
			test_case.result_variable_type = variable_type;
			test_case.variable_type		   = variable_type;

			/* Run the iteration */
			initTestIteration(test_case);

			m_has_test_passed &= executeTestIteration(test_case);
		} /* for (all operation types) */
	}	 /* for (all variable types) */

	/* All done. */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}